

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void showCursor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (((window->x11).cursorGrabbed != '\0') && (window->monitor == (_GLFWmonitor *)0x0)) {
    XUngrabPointer(_glfw.x11.display,0);
    (window->x11).cursorGrabbed = '\0';
  }
  if ((window->x11).cursorHidden != '\0') {
    XUndefineCursor(_glfw.x11.display,(window->x11).handle);
    (window->x11).cursorHidden = '\0';
  }
  return;
}

Assistant:

static void showCursor(_GLFWwindow* window)
{
    // Un-grab cursor (in windowed mode only; in fullscreen mode we still
    // want the cursor grabbed in order to confine the cursor to the window
    // area)
    if (window->x11.cursorGrabbed && window->monitor == NULL)
    {
        XUngrabPointer(_glfw.x11.display, CurrentTime);
        window->x11.cursorGrabbed = GL_FALSE;
    }

    // Show cursor
    if (window->x11.cursorHidden)
    {
        XUndefineCursor(_glfw.x11.display, window->x11.handle);
        window->x11.cursorHidden = GL_FALSE;
    }
}